

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessMemberTestSuite.cpp
# Opt level: O0

bool changeValueOfSimpleMember(void)

{
  int *piVar1;
  bool local_91;
  int *local_70;
  int *local_68;
  reference_wrapper<int> local_60 [3];
  reference_wrapper<int> local_48;
  undefined1 local_40 [8];
  Test t;
  
  Test::Test((Test *)local_40);
  local_48 = accessor::accessMember<TestFoo,Test>((Test *)local_40);
  piVar1 = std::reference_wrapper<int>::get(&local_48);
  *piVar1 = 100;
  local_60[0] = accessor::accessMember<TestFoo2,Test>((Test *)local_40);
  piVar1 = std::reference_wrapper<int>::get(local_60);
  *piVar1 = 0x65;
  local_68 = (int *)accessor::accessMember<TestFoo,Test>((Test *)local_40);
  piVar1 = std::reference_wrapper::operator_cast_to_int_((reference_wrapper *)&local_68);
  local_91 = false;
  if (*piVar1 == 100) {
    local_70 = (int *)accessor::accessMember<TestFoo2,Test>((Test *)local_40);
    piVar1 = std::reference_wrapper::operator_cast_to_int_((reference_wrapper *)&local_70);
    local_91 = *piVar1 == 0x65;
  }
  Test::~Test((Test *)local_40);
  return local_91;
}

Assistant:

bool changeValueOfSimpleMember()
{
  Test t;

  ::accessor::accessMember<TestFoo>(t).get() = 100;
  ::accessor::accessMember<TestFoo2>(t).get() = 101;
  return (::accessor::accessMember<TestFoo>(t) == 100)
      && (::accessor::accessMember<TestFoo2>(t) == 101);
}